

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# linked-list.cpp
# Opt level: O0

void __thiscall LinkedList::deletion(LinkedList *this,Node **head,int number)

{
  ostream *this_00;
  Node *local_30;
  Node *next;
  Node *last;
  Node **ppNStack_18;
  int number_local;
  Node **head_local;
  LinkedList *this_local;
  
  next = *head;
  local_30 = (Node *)0x0;
  last._4_4_ = number;
  ppNStack_18 = head;
  head_local = (Node **)this;
  if (next == (Node *)0x0) {
    this_00 = std::operator<<((ostream *)&std::cout,"Empty Linked List");
    std::ostream::operator<<(this_00,std::endl<char,std::char_traits<char>>);
  }
  else if (next->next == (Node *)0x0) {
    freeUpMemory(this,head);
  }
  else if (next->data == number) {
    *head = next->next;
    freeUpMemory(this,&next);
  }
  else {
    while (next->next != (Node *)0x0) {
      local_30 = next->next;
      if (local_30->data == last._4_4_) {
        if (local_30->next == (Node *)0x0) {
          next->next = (Node *)0x0;
        }
        else {
          next->next = local_30->next;
        }
        freeUpMemory(this,&local_30);
      }
      else {
        next = next->next;
      }
    }
  }
  return;
}

Assistant:

void LinkedList::deletion(Node** head, int number) {
	Node* last = *head;
	Node* next = nullptr;

	// Check if any node exists in linked list
	if (last == NULL) {
		std::cout << "Empty Linked List" << std::endl;
		return;
	}

	// Check if only one node is in linked list
	if (last->next == nullptr) {
		freeUpMemory(head);
		return;
	}

	// Check if node to delete is first node
	if (last->data == number) {
		*head = last->next;
		freeUpMemory(&last);
		return;
	}

	// Loop through and find node to delete
	while (last->next != nullptr) {
		next = last->next;
		if (next->data == number) {
			if (next->next == nullptr) {
				last->next = nullptr;
			} else {
				last->next = next->next;
			}
			freeUpMemory(&next);
		}
		else {
			last = last->next;
			continue;
		}
	}
}